

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

int QUtil::seek(FILE *stream,qpdf_offset_t offset,int whence)

{
  int iVar1;
  long __off;
  qpdf_offset_t qStack_18;
  int whence_local;
  qpdf_offset_t offset_local;
  FILE *stream_local;
  
  qStack_18 = offset;
  offset_local = (qpdf_offset_t)stream;
  __off = QIntC::IntConverter<long_long,_long,_true,_true>::convert(&stack0xffffffffffffffe8);
  iVar1 = fseeko((FILE *)stream,__off,whence);
  return iVar1;
}

Assistant:

int
QUtil::seek(FILE* stream, qpdf_offset_t offset, int whence)
{
#if HAVE_FSEEKO
    return fseeko(stream, QIntC::IntConverter<qpdf_offset_t, off_t>::convert(offset), whence);
#elif HAVE_FSEEKO64
    return fseeko64(stream, offset, whence);
#else
# if defined _MSC_VER || defined __BORLANDC__
    return _fseeki64(stream, offset, whence);
# else
    return fseek(stream, QIntC::to_long(offset), whence);
# endif
#endif
}